

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O0

void __thiscall App::keyPressed(App *this,int key)

{
  int key_local;
  App *this_local;
  
  if (key == 0x20) goto LAB_001645c2;
  if (key == 0x41) {
LAB_00164597:
    Character::startRunning(&this->character,true);
    return;
  }
  if (key != 0x44) {
    if (key == 0x53) {
LAB_001645d4:
      Character::startDucking(&this->character);
      return;
    }
    if (key != 0x57) {
      if (key == 0x101) {
        if (((this->state != STARTSCREEN) && (this->state != GAMEOVER)) && (this->state != VICTORY))
        {
          return;
        }
        reset(this);
        this->state = GAME;
        return;
      }
      if (key == 0x106) goto LAB_001645ae;
      if (key == 0x107) goto LAB_00164597;
      if (key == 0x108) goto LAB_001645d4;
      if (key != 0x109) {
        return;
      }
    }
LAB_001645c2:
    Character::startJumping(&this->character);
    return;
  }
LAB_001645ae:
  Character::startRunning(&this->character,false);
  return;
}

Assistant:

void App::keyPressed(int key) {
    switch (key) {
        case 263: // left arrow
        case 'A':
            character.startRunning(true);
            break;
        case 262: // right arrow
        case 'D':
            character.startRunning(false);
            break;
        case 265: // up arrow
        case 'W':
        case ' ':
            character.startJumping();
            break;
        case 264: // down arrow
        case 'S':
            character.startDucking();
            // bricks.clear(); // for debug
            break;
        case 257: // enter
            if (state == STARTSCREEN || state == GAMEOVER || state == VICTORY) {
                reset();
                state = GAME;
            }
    }
}